

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_show_help(char *name)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char logs [256];
  
  _mpp_log_l(4,"mpi_enc_utils","usage: %s [options]\n",0,name);
  uVar3 = 1;
  lVar6 = 0x10;
  uVar4 = 1;
  uVar5 = 1;
  while( true ) {
    if (lVar6 == 0x4f0) break;
    if (*(char **)(test_mpp_run::uuid_debug_info + lVar6) != (char *)0x0) {
      sVar2 = strlen(*(char **)(test_mpp_run::uuid_debug_info + lVar6));
      uVar1 = (uint)sVar2;
      if ((uint)sVar2 < (uint)uVar5) {
        uVar1 = (uint)uVar5;
      }
      uVar5 = (ulong)uVar1;
    }
    if (*(char **)(test_mpp_run::uuid_debug_info + lVar6 + 8) != (char *)0x0) {
      sVar2 = strlen(*(char **)(test_mpp_run::uuid_debug_info + lVar6 + 8));
      uVar1 = (uint)sVar2;
      if ((uint)sVar2 < (uint)uVar4) {
        uVar1 = (uint)uVar4;
      }
      uVar4 = (ulong)uVar1;
    }
    __s = *(char **)((long)&enc_opts[0].name + lVar6);
    uVar1 = uVar3;
    if (__s != (char *)0x0) {
      sVar2 = strlen(__s);
      uVar1 = (uint)sVar2;
      if ((uint)sVar2 < uVar3) {
        uVar1 = uVar3;
      }
    }
    uVar3 = uVar1;
    lVar6 = lVar6 + 0x20;
  }
  snprintf(logs,0xff,"-%%-%ds %%-%ds %%-%ds\n",uVar5,uVar4,(ulong)uVar3);
  for (lVar6 = 0x10; lVar6 != 0x4f0; lVar6 = lVar6 + 0x20) {
    _mpp_log_l(4,"mpi_enc_utils",logs,0,*(undefined8 *)(test_mpp_run::uuid_debug_info + lVar6),
               *(undefined8 *)(test_mpp_run::uuid_debug_info + lVar6 + 8),
               *(undefined8 *)((long)&enc_opts[0].name + lVar6));
  }
  mpp_show_support_format();
  mpp_show_color_format();
  return -1;
}

Assistant:

RK_S32 mpi_enc_show_help(const char *name)
{
    RK_U32 max_name = 1;
    RK_U32 max_full_name = 1;
    RK_U32 max_help = 1;
    char logs[256];
    RK_U32 len;
    RK_U32 i;

    mpp_log("usage: %s [options]\n", name);

    for (i = 0; i < enc_opt_cnt; i++) {
        MppOptInfo *opt = &enc_opts[i];

        if (opt->name) {
            len = strlen(opt->name);
            if (len > max_name)
                max_name = len;
        }

        if (opt->full_name) {
            len = strlen(opt->full_name);
            if (len > max_full_name)
                max_full_name = len;
        }

        if (opt->help) {
            len = strlen(opt->help);
            if (len > max_help)
                max_help = len;
        }
    }

    snprintf(logs, sizeof(logs) - 1, "-%%-%ds %%-%ds %%-%ds\n", max_name, max_full_name, max_help);

    for (i = 0; i < enc_opt_cnt; i++) {
        MppOptInfo *opt = &enc_opts[i];

        mpp_log(logs, opt->name, opt->full_name, opt->help);
    }
    mpp_show_support_format();
    mpp_show_color_format();

    return -1;
}